

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

uint32_t __thiscall
asmjit::v1_14::RALocalAllocator::decideOnSpillFor
          (RALocalAllocator *this,RegGroup group,uint32_t workId,RegMask spillableRegs,
          uint32_t *spillWorkId)

{
  uint **ppuVar1;
  uint **ppuVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  WorkToPhysMap *pWVar7;
  PhysToWorkMap *pPVar8;
  PhysToWorkMap *pPVar9;
  uint *puVar10;
  uint *puVar11;
  uint *puVar12;
  uint uVar13;
  RegGroup RVar14;
  uint uVar15;
  Error EVar16;
  uint32_t uVar17;
  RABlock *pRVar18;
  BaseNode *pBVar19;
  uint uVar20;
  ulong uVar21;
  RABlock *block;
  uint uVar22;
  ulong unaff_RBX;
  long lVar23;
  ulong unaff_RBP;
  undefined7 in_register_00000031;
  BaseNode *pBVar24;
  InstNode *node;
  BaseCompiler *pBVar25;
  RALocalAllocator *this_00;
  uint uVar26;
  ulong uVar27;
  ulong unaff_R12;
  InstNode *pIVar28;
  uint uVar29;
  long lVar30;
  bool bVar31;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  long lStack_b0;
  ulong uStack_a8;
  InstNode *pIStack_a0;
  RALocalAllocator *pRStack_98;
  long lStack_90;
  code *pcStack_88;
  ulong uStack_78;
  RALocalAllocator *pRStack_70;
  InstNode *pIStack_68;
  BaseNode *pBStack_60;
  ulong uStack_58;
  ulong uStack_50;
  
  pBVar24 = (BaseNode *)CONCAT71(in_register_00000031,group);
  if (spillableRegs == 0) {
LAB_00123944:
    decideOnSpillFor();
  }
  else if (group < kPC) {
    uVar15 = 0;
    if (spillableRegs != 0) {
      for (; (spillableRegs >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
      }
    }
    pBVar24 = (BaseNode *)(this->_curAssignment)._physToWorkIds._data[group];
    uVar20 = *(uint *)(pBVar24 + (ulong)uVar15 * 4);
    uVar21 = (ulong)uVar20;
    uVar26 = spillableRegs - 1 & spillableRegs;
    if (uVar26 == 0) {
LAB_00123933:
      *spillWorkId = uVar20;
      return uVar15;
    }
    uVar4 = *(uint *)&this->_pass->field_0x148;
    if (uVar20 < uVar4) {
      lVar30 = *(long *)&this->_pass->_workRegs;
      uVar22 = (uint)(*(float *)(*(long *)(lVar30 + uVar21 * 8) + 100) * 1048576.0);
      uVar5 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[group];
      this = (RALocalAllocator *)(ulong)uVar5;
      uVar20 = uVar22 + 0x40000;
      if ((uVar5 >> (uVar15 & 0x1f) & 1) == 0) {
        uVar20 = uVar22;
      }
      uVar27 = (ulong)uVar20;
      do {
        uVar22 = 0;
        if (uVar26 != 0) {
          for (; (uVar26 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        unaff_RBX = (ulong)uVar22;
        uVar20 = *(uint *)(pBVar24 + unaff_RBX * 4);
        if (uVar4 <= uVar20) {
          decideOnSpillFor();
          goto LAB_00123944;
        }
        uVar29 = (uint)(*(float *)(*(long *)(lVar30 + (ulong)uVar20 * 8) + 100) * 1048576.0);
        uVar13 = uVar29 + 0x40000;
        if ((uVar5 >> (uVar22 & 0x1f) & 1) == 0) {
          uVar13 = uVar29;
        }
        unaff_R12 = (ulong)uVar13;
        bVar31 = uVar13 < (uint)uVar27;
        if (bVar31) {
          uVar21 = (ulong)uVar20;
          uVar27 = unaff_R12;
        }
        uVar20 = (uint)uVar21;
        if (bVar31) {
          uVar15 = uVar22;
        }
        uVar26 = uVar26 - 1 & uVar26;
        unaff_RBP = (ulong)uVar26;
      } while (uVar26 != 0);
      goto LAB_00123933;
    }
    goto LAB_0012394e;
  }
  decideOnSpillFor();
LAB_0012394e:
  decideOnSpillFor();
  lVar30 = *(long *)(pBVar24 + 0x20);
  node = (InstNode *)(ulong)*(uint *)(lVar30 + 0x10);
  if (node != (InstNode *)0x0) {
    pRStack_70 = (RALocalAllocator *)&this->_curAssignment;
    lVar23 = lVar30 + 0x54;
    pIVar28 = (InstNode *)0x0;
    this_00 = this;
    pIStack_68 = node;
    pBStack_60 = pBVar24;
    uStack_58 = unaff_RBX;
    uStack_50 = unaff_R12;
    do {
      if ((InstNode *)(ulong)*(uint *)(lVar30 + 0x10) <= pIVar28) {
        pcStack_88 = (code *)0x123a70;
        spillAfterAllocation();
LAB_00123a70:
        pcStack_88 = (code *)0x123a75;
        spillAfterAllocation();
LAB_00123a75:
        pcStack_88 = (code *)0x123a7a;
        spillAfterAllocation();
LAB_00123a7a:
        pcStack_88 = (code *)0x123a7f;
        spillAfterAllocation();
LAB_00123a7f:
        pcStack_88 = allocBranch;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = *(BaseNode **)node;
        lStack_b0 = lVar23;
        uStack_a8 = unaff_R12;
        pIStack_a0 = pIVar28;
        pRStack_98 = this;
        lStack_90 = lVar30;
        pcStack_88 = (code *)unaff_RBP;
        if ((*(PhysToWorkMap **)(block + 200) != (PhysToWorkMap *)0x0) &&
           (EVar16 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                        (ZoneBitVector *)(block + 0x78),
                                        SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),true),
           EVar16 != 0)) {
          return EVar16;
        }
        EVar16 = allocInst(this_00,node);
        if (EVar16 != 0) {
          return EVar16;
        }
        uVar15 = *(uint *)(block + 0xb8);
        if ((ulong)uVar15 == 0xffffffff) {
          pRVar18 = block + 0xbc;
LAB_00123b18:
          EVar16 = spillScratchGpRegsBeforeEntry(this_00,*(RegMask *)pRVar18);
          if (EVar16 != 0) {
            return EVar16;
          }
          if (*(long *)(block + 200) == 0) {
            EVar16 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar16 != 0) {
              return EVar16;
            }
          }
          else {
            pBVar24 = *(BaseNode **)this_00->_pass->_extraBlock;
            pBVar19 = BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,pBVar24);
            pWVar7 = (this_00->_curAssignment)._workToPhysMap;
            memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap
                   ,(ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
            memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar7,
                   (ulong)(this_00->_tmpAssignment)._layout.workCount);
            EVar16 = switchToAssignment(this_00,*(PhysToWorkMap **)(block + 200),
                                        (ZoneBitVector *)(block + 0x78),
                                        SUB41((*(uint *)(block + 0xc) & 8) >> 3,0),false);
            if (EVar16 != 0) {
              return EVar16;
            }
            pBVar25 = this_00->_cc;
            if ((pBVar25->super_BaseBuilder)._cursor != pBVar24) {
              if ((uint)(byte)node[0x13] <= (byte)node[0x12] - 1) goto LAB_00123cba;
              lVar30 = (ulong)((byte)node[0x12] - 1) * 0x10;
              if ((*(uint *)(node + lVar30 + 0x40) & 7) != 5) goto LAB_00123cbf;
              (*(pBVar25->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_d8);
              uStack_c8 = *(undefined8 *)(node + lVar30 + 0x40);
              uStack_c0 = *(undefined8 *)(node + lVar30 + 0x48);
              *(undefined4 *)(node + lVar30 + 0x40) = uStack_d8;
              *(undefined4 *)(node + lVar30 + 0x44) = uStack_d4;
              *(undefined4 *)(node + lVar30 + 0x48) = uStack_d0;
              *(undefined4 *)(node + lVar30 + 0x4c) = uStack_cc;
              node[0x34] = (InstNode)((byte)node[0x34] & 0xef);
              uVar17 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
              if (uVar17 != 0) {
                return uVar17;
              }
              pBVar25 = this_00->_cc;
              (pBVar25->super_BaseBuilder)._cursor = pBVar24;
              (*(pBVar25->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar25,&uStack_d8);
              pBVar25 = this_00->_cc;
            }
            (pBVar25->super_BaseBuilder)._cursor = pBVar19;
            pWVar7 = (this_00->_curAssignment)._workToPhysMap;
            pPVar8 = (this_00->_curAssignment)._physToWorkMap;
            pPVar9 = (this_00->_tmpAssignment)._physToWorkMap;
            (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
            (this_00->_curAssignment)._physToWorkMap = pPVar9;
            (this_00->_tmpAssignment)._workToPhysMap = pWVar7;
            (this_00->_tmpAssignment)._physToWorkMap = pPVar8;
            lVar30 = 0;
            do {
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar30;
              puVar10 = *ppuVar1;
              puVar11 = ppuVar1[1];
              ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar30;
              puVar12 = ppuVar2[1];
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds._data + lVar30;
              *ppuVar1 = *ppuVar2;
              ppuVar1[1] = puVar12;
              ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds._data + lVar30;
              *ppuVar1 = puVar10;
              ppuVar1[1] = puVar11;
              lVar30 = lVar30 + 2;
            } while (lVar30 != 4);
          }
          uVar17 = 0;
        }
        else {
          if (uVar15 < *(uint *)(*(long *)block + 0xf0)) {
            pRVar18 = (RABlock *)((ulong)uVar15 * 0x20 + *(long *)(*(long *)block + 0xe8));
            goto LAB_00123b18;
          }
          allocBranch();
LAB_00123cba:
          allocBranch();
LAB_00123cbf:
          uVar17 = 3;
        }
        return uVar17;
      }
      if ((*(byte *)(lVar23 + 2) & 2) != 0) {
        uVar15 = *(uint *)(lVar23 + -8);
        unaff_R12 = (ulong)uVar15;
        if (*(uint *)&this->_pass->field_0x148 <= uVar15) goto LAB_00123a70;
        lVar6 = *(long *)(*(long *)&this->_pass->_workRegs + unaff_R12 * 8);
        if (*(char *)(lVar6 + 0x4a) != -1) goto LAB_00123a4a;
        if ((this->_curAssignment)._layout.workCount <= uVar15) goto LAB_00123a75;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_RBP = (ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_00123a4a;
        RVar14 = *(RegGroup *)(lVar6 + 0x21);
        (this->_cc->super_BaseBuilder)._cursor = pBStack_60;
        if (0x1f < bVar3) goto LAB_00123a7a;
        RVar14 = RVar14 & kMaxValue;
        if (RVar14 < kPC) {
          if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks._data[RVar14] >>
               (bVar3 & 0x1f) & 1) != 0) {
            pcStack_88 = (code *)0x123a2d;
            uStack_78 = (ulong)RVar14;
            EVar16 = onSaveReg(this,RVar14,uVar15,(uint)bVar3);
            RVar14 = (RegGroup)uStack_78;
            if (EVar16 != 0) {
              return EVar16;
            }
          }
          pcStack_88 = (code *)0x123a45;
          this_00 = pRStack_70;
          RAAssignment::unassign((RAAssignment *)pRStack_70,RVar14,uVar15,(uint)bVar3);
          node = pIStack_68;
          goto LAB_00123a4a;
        }
        goto LAB_00123a7f;
      }
LAB_00123a4a:
      pIVar28 = pIVar28 + 1;
      lVar23 = lVar23 + 0x20;
    } while (node != pIVar28);
  }
  return 0;
}

Assistant:

uint32_t RALocalAllocator::decideOnSpillFor(RegGroup group, uint32_t workId, RegMask spillableRegs, uint32_t* spillWorkId) const noexcept {
  // May be used in the future to decide which register would be best to spill so `workId` can be assigned.
  DebugUtils::unused(workId);
  ASMJIT_ASSERT(spillableRegs != 0);

  Support::BitWordIterator<RegMask> it(spillableRegs);
  uint32_t bestPhysId = it.next();
  uint32_t bestWorkId = _curAssignment.physToWorkId(group, bestPhysId);

  // Avoid calculating the cost model if there is only one spillable register.
  if (it.hasNext()) {
    uint32_t bestCost = calculateSpillCost(group, bestWorkId, bestPhysId);
    do {
      uint32_t localPhysId = it.next();
      uint32_t localWorkId = _curAssignment.physToWorkId(group, localPhysId);
      uint32_t localCost = calculateSpillCost(group, localWorkId, localPhysId);

      if (localCost < bestCost) {
        bestCost = localCost;
        bestPhysId = localPhysId;
        bestWorkId = localWorkId;
      }
    } while (it.hasNext());
  }

  *spillWorkId = bestWorkId;
  return bestPhysId;
}